

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,bool *params,
          char (*params_1) [19],longlong *params_2,longlong *params_3,longlong *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  CappedArray<char,_26UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  CappedArray<char,_26UL> *params_03;
  long lVar4;
  CappedArray<char,_26UL> *pCVar5;
  CappedArray<char,_26UL> *__return_storage_ptr__;
  String argValues [5];
  String *pSVar6;
  undefined8 uVar7;
  CappedArray<char,_26UL> local_d0;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_d0.currentSize = 0x186570;
  if ((ulong)*params != 0) {
    local_d0.currentSize = 0x1932df;
  }
  local_d0.content._0_8_ = 6 - (ulong)*params;
  concat<kj::StringPtr>(&local_a8,(StringPtr *)&local_d0);
  local_d0.content._0_8_ = strlen(*params_1);
  pCVar5 = &local_d0;
  local_d0.currentSize = (size_t)params_1;
  concat<kj::ArrayPtr<char_const>>(&local_90,(_ *)pCVar5,params_00);
  __return_storage_ptr__ = &local_d0;
  Stringifier::operator*(__return_storage_ptr__,(Stringifier *)pCVar5,*params_2);
  concat<kj::CappedArray<char,26ul>>(&local_78,(_ *)__return_storage_ptr__,params_01);
  pCVar5 = &local_d0;
  Stringifier::operator*(pCVar5,(Stringifier *)__return_storage_ptr__,*params_3);
  concat<kj::CappedArray<char,26ul>>(&local_60,(_ *)pCVar5,params_02);
  Stringifier::operator*(&local_d0,(Stringifier *)pCVar5,*params_4);
  concat<kj::CappedArray<char,26ul>>(&local_48,(_ *)&local_d0,params_03);
  pSVar6 = &local_a8;
  uVar7 = 5;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)&local_a8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_a8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_a8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar6,uVar7);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}